

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_substr_count(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  uint uVar2;
  char *pBlob;
  char *pPattern;
  uint uVar3;
  jx9_value *pjVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  int nTextlen;
  int nPatlen;
  sxu32 nOfft;
  uint local_48;
  sxu32 local_44;
  jx9_context *local_40;
  sxu32 local_34;
  
  if (1 < nArg) {
    pBlob = jx9_value_to_string(*apArg,(int *)&local_48);
    pPattern = jx9_value_to_string(apArg[1],(int *)&local_44);
    uVar5 = (ulong)(int)local_48;
    if (((0 < (long)uVar5) && (0 < (int)local_44)) && ((int)local_44 <= (int)local_48)) {
      if (nArg != 2) {
        pjVar4 = apArg[2];
        jx9MemObjToInteger(pjVar4);
        uVar2 = (uint)(pjVar4->x).iVal;
        if (((int)uVar2 < 0) || (uVar3 = local_48 - uVar2, (int)local_48 < (int)uVar2))
        goto LAB_0012f8f4;
        pBlob = pBlob + (uVar2 & 0x7fffffff);
        local_48 = uVar3;
        if ((uint)nArg < 4) {
          uVar5 = (ulong)(int)uVar3;
        }
        else {
          pjVar4 = apArg[3];
          jx9MemObjToInteger(pjVar4);
          uVar2 = (uint)(pjVar4->x).iVal;
          if (((int)uVar2 < 0) || ((int)local_48 < (int)uVar2)) goto LAB_0012f8f4;
          uVar5 = (ulong)(uVar2 & 0x7fffffff);
          local_48 = uVar2;
        }
      }
      pcVar6 = pBlob + uVar5;
      iVar7 = 0;
      local_40 = pCtx;
      do {
        sVar1 = SyBlobSearch(pBlob,(int)pcVar6 - (int)pBlob,pPattern,local_44,&local_34);
        if (sVar1 != 0) break;
        iVar7 = iVar7 + 1;
        pBlob = pBlob + (local_34 + local_44);
      } while (pBlob < pcVar6);
      pjVar4 = local_40->pRet;
      jx9MemObjRelease(pjVar4);
      pjVar4->x = (anon_union_8_3_18420de5_for_x)(long)iVar7;
      goto LAB_0012f907;
    }
  }
LAB_0012f8f4:
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
LAB_0012f907:
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_substr_count(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zText, *zPattern, *zEnd;
	int nTextlen, nPatlen;
	int iCount = 0;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the haystack */
	zText = jx9_value_to_string(apArg[0], &nTextlen);
	/* Point to the neddle */
	zPattern = jx9_value_to_string(apArg[1], &nPatlen);
	if( nTextlen < 1 || nPatlen < 1 || nPatlen > nTextlen ){
		/* NOOP, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 || nOfft > nTextlen ){
			/* Invalid offset, return zero */
			jx9_result_int(pCtx, 0);
			return JX9_OK;
		}
		/* Point to the desired offset */
		zText = &zText[nOfft];
		/* Adjust length */
		nTextlen -= nOfft;
	}
	/* Point to the end of the string */
	zEnd = &zText[nTextlen];
	if( nArg > 3 ){
		int nLen;
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[3]);
		if( nLen < 0 || nLen > nTextlen ){
			/* Invalid length, return 0 */
			jx9_result_int(pCtx, 0);
			return JX9_OK;
		}
		/* Adjust pointer */
		nTextlen = nLen;
		zEnd = &zText[nTextlen];
	}
	/* Perform the search */
	for(;;){
		rc = SyBlobSearch((const void *)zText, (sxu32)(zEnd-zText), (const void *)zPattern, nPatlen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, break immediately */
			break;
		}
		/* Increment counter and update the offset */
		iCount++;
		zText += nOfft + nPatlen;
		if( zText >= zEnd ){
			break;
		}
	}
	/* Pattern count */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}